

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

TIntermTyped * __thiscall
glslang::TParseContext::handleFunctionCall
          (TParseContext *this,TSourceLoc *loc,TFunction *function,TIntermNode *arguments)

{
  EShSource EVar1;
  TSymbolTable *pTVar2;
  iterator __position;
  TString name;
  TString structName;
  bool bVar3;
  char cVar4;
  int iVar5;
  TOperator op;
  uint uVar6;
  int iVar7;
  TIntermConstantUnion *result;
  TFunction *function_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long lVar8;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  long lVar9;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined8 uVar10;
  undefined4 extraout_var_10;
  long *plVar11;
  long lVar12;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  long *plVar13;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  TPoolAllocator *pTVar14;
  undefined4 extraout_var_27;
  TIntermAggregate *callNode;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  vector<glslang::TStorageQualifier,glslang::pool_allocator<glslang::TStorageQualifier>> *this_00;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  undefined4 extraout_var_36;
  long *plVar15;
  undefined4 extraout_var_37;
  undefined4 extraout_var_38;
  undefined8 *puVar16;
  TType *caller;
  ulong uVar17;
  TIntermediate *pTVar18;
  char *__end;
  TInfoSink *pTVar19;
  bool builtIn;
  TType type;
  undefined8 in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffe90;
  bool in_stack_fffffffffffffe97;
  TIntermNode *node;
  TIntermNode *pTVar20;
  TParseContext *pTVar21;
  undefined8 in_stack_fffffffffffffea8;
  TSourceLoc *pTVar22;
  undefined8 in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  TPoolAllocator *local_118;
  undefined1 *local_110;
  undefined1 local_100 [16];
  TString local_f0;
  TType local_c8;
  undefined4 extraout_var_28;
  
  node = arguments;
  if ((((this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkan == 0) ||
      ((this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkanRelaxed != true)) ||
     (result = (TIntermConstantUnion *)vkRelaxedRemapFunctionCall(this,loc,function,arguments),
     result == (TIntermConstantUnion *)0x0)) {
    iVar5 = (*(function->super_TSymbol)._vptr_TSymbol[0x1b])(function);
    if (iVar5 == 0x1ee) {
      result = (TIntermConstantUnion *)handleLengthMethod(this,loc,function,arguments);
    }
    else {
      iVar5 = (*(function->super_TSymbol)._vptr_TSymbol[0x1b])(function);
      if (iVar5 == 0) {
        bVar3 = false;
        pTVar21 = this;
        function_00 = findFunction(this,loc,function,(bool *)&stack0xfffffffffffffe97);
        if (function_00 == (TFunction *)0x0) {
          result = (TIntermConstantUnion *)0x0;
        }
        else {
          if ((bVar3 == true) &&
             ((iVar5 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x1b])(function_00),
              iVar5 == 0xf8 ||
              (iVar5 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x1b])(function_00),
              iVar5 == 0xf9)))) {
            iVar5 = (*(function_00->super_TSymbol)._vptr_TSymbol[3])(function_00);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                      (this,loc,1,&E_GL_EXT_shader_quad_control,
                       *(undefined8 *)(CONCAT44(extraout_var,iVar5) + 8));
          }
          if ((bVar3 == true) &&
             (iVar5 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x11])(function_00), iVar5 != 0))
          {
            uVar6 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x11])(function_00);
            iVar5 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x12])(function_00);
            this = pTVar21;
            iVar7 = (*(function_00->super_TSymbol)._vptr_TSymbol[3])(function_00);
            pTVar21 = this;
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                      (this,loc,(ulong)uVar6,CONCAT44(extraout_var_00,iVar5),
                       *(undefined8 *)(CONCAT44(extraout_var_01,iVar7) + 8));
          }
          if (bVar3 == true) {
            iVar5 = (*(function_00->super_TSymbol)._vptr_TSymbol[0xc])(function_00);
            cVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar5) + 400))
                              ((long *)CONCAT44(extraout_var_02,iVar5),3);
            if (cVar4 != '\0') {
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x15])
                        (this,loc,"built-in function",
                         "float16 types can only be in uniform block or buffer storage");
            }
          }
          if (bVar3 == true) {
            iVar5 = (*(function_00->super_TSymbol)._vptr_TSymbol[0xc])(function_00);
            plVar15 = (long *)CONCAT44(extraout_var_03,iVar5);
            cVar4 = (**(code **)(*plVar15 + 400))(plVar15,6);
            if ((cVar4 != '\0') || (cVar4 = (**(code **)(*plVar15 + 400))(plVar15,7), cVar4 != '\0')
               ) {
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x18])
                        (this,loc,"built-in function",
                         "(u)int16 types can only be in uniform block or buffer storage");
            }
          }
          if (bVar3 == true) {
            iVar5 = (*(function_00->super_TSymbol)._vptr_TSymbol[0xc])(function_00);
            plVar15 = (long *)CONCAT44(extraout_var_04,iVar5);
            cVar4 = (**(code **)(*plVar15 + 400))(plVar15,4);
            if ((cVar4 != '\0') || (cVar4 = (**(code **)(*plVar15 + 400))(plVar15,5), cVar4 != '\0')
               ) {
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x1b])
                        (this,loc,"built-in function",
                         "(u)int8 types can only be in uniform block or buffer storage");
            }
          }
          if ((bVar3 == true) &&
             ((iVar5 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x1b])(function_00),
              iVar5 == 0x210 ||
              (iVar5 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x1b])(function_00),
              iVar5 == 0x207)))) {
            iVar5 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x28])(function_00,0);
            lVar8 = (**(code **)(**(long **)(CONCAT44(extraout_var_05,iVar5) + 8) + 0x48))();
            if (((*(byte *)(lVar8 + 2) & 4) != 0) &&
               ((this->super_TParseContextBase).super_TParseVersions.version < 0x8d)) {
              iVar5 = (*(function_00->super_TSymbol)._vptr_TSymbol[3])(function_00);
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                        (this,loc,1,&E_GL_ARB_texture_multisample,
                         *(undefined8 *)(CONCAT44(extraout_var_06,iVar5) + 8));
            }
          }
          if (arguments != (TIntermNode *)0x0) {
            iVar5 = (*arguments->_vptr_TIntermNode[6])(arguments);
            plVar15 = (long *)CONCAT44(extraout_var_07,iVar5);
            iVar5 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x24])(function_00);
            if (0 < iVar5) {
              lVar8 = 0;
              uVar17 = 0;
              do {
                iVar5 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x24])(function_00);
                puVar16 = (undefined8 *)&stack0xfffffffffffffe98;
                pTVar20 = node;
                this = pTVar21;
                if ((plVar15 != (long *)0x0) && (iVar5 != 1)) {
                  lVar9 = (**(code **)(*plVar15 + 400))();
                  puVar16 = (undefined8 *)(*(long *)(lVar9 + 8) + lVar8);
                  pTVar20 = node;
                  this = pTVar21;
                }
                plVar13 = (long *)*puVar16;
                iVar5 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x28])
                                  (function_00,uVar17 & 0xffffffff);
                lVar9 = (**(code **)(**(long **)(CONCAT44(extraout_var_08,iVar5) + 8) + 0x50))();
                node = pTVar20;
                if ((*(uint *)(lVar9 + 8) & 0x7f) - 0x11 < 2) {
                  iVar5 = (**pTVar20->_vptr_TIntermNode)(pTVar20);
                  uVar10 = (**(code **)(*plVar13 + 0x18))(plVar13);
                  iVar5 = (*(this->super_TParseContextBase).super_TParseVersions.
                            _vptr_TParseVersions[0x42])
                                    (this,CONCAT44(extraout_var_09,iVar5),"assign",uVar10);
                  if ((char)iVar5 != '\0') {
                    iVar5 = (**pTVar20->_vptr_TIntermNode)(pTVar20);
                    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
                      [0x2d])(this,CONCAT44(extraout_var_10,iVar5),
                              "Non-L-value cannot be passed for \'out\' or \'inout\' parameters.",
                              "out","");
                  }
                }
                if ((*(byte *)(lVar9 + 0xf) & 0x10) != 0) {
                  plVar11 = (long *)(**(code **)(*plVar13 + 0x18))(plVar13);
                  lVar12 = (**(code **)(*plVar11 + 0x108))(plVar11);
                  if ((*(ulong *)(lVar12 + 8) & 0x10000007f) != 2) {
                    iVar5 = (**node->_vptr_TIntermNode)();
                    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
                      [0x2d])(this,CONCAT44(extraout_var_11,iVar5),
                              "Non front-end constant expressions cannot be passed for \'spirv_literal\' parameters."
                              ,"spirv_literal","");
                  }
                }
                plVar11 = (long *)(**(code **)(*plVar13 + 0x18))(plVar13);
                plVar11 = (long *)(**(code **)(*plVar11 + 0xf0))(plVar11);
                lVar12 = (**(code **)(*plVar11 + 0x58))(plVar11);
                pTVar18 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
                if ((pTVar18->bindlessImageModeCaller)._M_t._M_impl.super__Rb_tree_header.
                    _M_node_count == 0 &&
                    (pTVar18->bindlessTextureModeCaller)._M_t._M_impl.super__Rb_tree_header.
                    _M_node_count == 0) {
                  cVar4 = '\0';
                }
                else {
                  cVar4 = (**(code **)(*plVar11 + 0x1b8))(plVar11);
                }
                if (((cVar4 == '\0') && ((*(ulong *)(lVar12 + 8) & 0x3ffc00000000000) != 0)) &&
                   ((cVar4 = (**(code **)(*plVar11 + 0x1b0))(plVar11), pTVar21 = this, cVar4 != '\0'
                    || (iVar5 = (**(code **)(*plVar11 + 0x38))(plVar11), pTVar21 = this,
                       iVar5 == 0x12)))) {
                  this = pTVar21;
                  if (((*(ulong *)(lVar12 + 8) & 0x4000000000000) != 0) &&
                     ((*(ulong *)(lVar9 + 8) & 0x4000000000000) == 0)) {
                    iVar5 = (**node->_vptr_TIntermNode)();
                    (*(pTVar21->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
                      [0x2d])(pTVar21,CONCAT44(extraout_var_12,iVar5),
                              "argument cannot drop memory qualifier when passed to formal parameter"
                              ,"volatile","");
                  }
                  if (((*(byte *)(lVar12 + 0xe) & 2) != 0) &&
                     ((*(ulong *)(lVar9 + 8) & 0x12000000000000) == 0)) {
                    iVar5 = (**node->_vptr_TIntermNode)();
                    (*(pTVar21->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
                      [0x2d])(pTVar21,CONCAT44(extraout_var_13,iVar5),
                              "argument cannot drop memory qualifier when passed to formal parameter"
                              ,"coherent","");
                  }
                  if (((*(byte *)(lVar12 + 0xe) & 0x10) != 0) &&
                     ((*(ulong *)(lVar9 + 8) & 0x12000000000000) == 0)) {
                    iVar5 = (**node->_vptr_TIntermNode)();
                    (*(pTVar21->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
                      [0x2d])(pTVar21,CONCAT44(extraout_var_14,iVar5),
                              "argument cannot drop memory qualifier when passed to formal parameter"
                              ,"devicecoherent","");
                  }
                  if (((*(byte *)(lVar12 + 0xe) & 0x20) != 0) &&
                     ((*(byte *)(lVar9 + 0xe) & 0x32) == 0)) {
                    iVar5 = (**node->_vptr_TIntermNode)();
                    (*(pTVar21->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
                      [0x2d])(pTVar21,CONCAT44(extraout_var_15,iVar5),
                              "argument cannot drop memory qualifier when passed to formal parameter"
                              ,"queuefamilycoherent","");
                  }
                  if (((*(byte *)(lVar12 + 0xe) & 0x40) != 0) &&
                     ((*(byte *)(lVar9 + 0xe) & 0x72) == 0)) {
                    iVar5 = (**node->_vptr_TIntermNode)();
                    (*(pTVar21->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
                      [0x2d])(pTVar21,CONCAT44(extraout_var_16,iVar5),
                              "argument cannot drop memory qualifier when passed to formal parameter"
                              ,"workgroupcoherent","");
                  }
                  if (((*(byte *)(lVar12 + 0xe) & 0x80) != 0) &&
                     ((*(byte *)(lVar9 + 0xe) & 0xf2) == 0)) {
                    iVar5 = (**node->_vptr_TIntermNode)();
                    (*(pTVar21->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
                      [0x2d])(pTVar21,CONCAT44(extraout_var_17,iVar5),
                              "argument cannot drop memory qualifier when passed to formal parameter"
                              ,"subgroupcoherent","");
                  }
                  if (((*(ulong *)(lVar12 + 8) & 0x800000000000) != 0) &&
                     ((*(ulong *)(lVar9 + 8) & 0x800000000000) == 0)) {
                    iVar5 = (**node->_vptr_TIntermNode)();
                    (*(pTVar21->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
                      [0x2d])(pTVar21,CONCAT44(extraout_var_18,iVar5),
                              "argument cannot drop memory qualifier when passed to formal parameter"
                              ,"readonly","");
                  }
                  if (((*(ulong *)(lVar12 + 8) & 0x1000000000000) != 0) &&
                     ((*(ulong *)(lVar9 + 8) & 0x1000000000000) == 0)) {
                    iVar5 = (**node->_vptr_TIntermNode)();
                    (*(pTVar21->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
                      [0x2d])(pTVar21,CONCAT44(extraout_var_19,iVar5),
                              "argument cannot drop memory qualifier when passed to formal parameter"
                              ,"writeonly","");
                  }
                  if (((*(ulong *)(lVar12 + 8) & 0x8000000000000) != 0) &&
                     ((*(ulong *)(lVar9 + 8) & 0x8000000000000) == 0)) {
                    iVar5 = (**node->_vptr_TIntermNode)();
                    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
                      [0x2d])(this,CONCAT44(extraout_var_20,iVar5),
                              "argument cannot drop memory qualifier when passed to formal parameter"
                              ,"nontemporal","");
                  }
                }
                pTVar21 = this;
                if (bVar3 == false) {
                  if ((*(char *)(lVar12 + 0x2c) != *(char *)(lVar9 + 0x2c)) &&
                     (((*(ulong *)(lVar9 + 8) & 0x1000000000000) == 0 ||
                      ((*(char *)(lVar12 + 0x2c) != '\0' && (*(char *)(lVar9 + 0x2c) != '\0')))))) {
                    iVar5 = (**node->_vptr_TIntermNode)();
                    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
                      [0x2d])(this,CONCAT44(extraout_var_21,iVar5),"image formats must match",
                              "format","");
                  }
                }
                if (bVar3 == true) {
                  plVar11 = (long *)(**(code **)(*plVar13 + 0x18))(plVar13);
                  plVar11 = (long *)(**(code **)(*plVar11 + 0xf0))(plVar11);
                  cVar4 = (**(code **)(*plVar11 + 400))(plVar11,3);
                  if (cVar4 != '\0') {
                    iVar5 = (**node->_vptr_TIntermNode)();
                    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
                      [0x15])(this,CONCAT44(extraout_var_22,iVar5),"built-in function",
                              "float16 types can only be in uniform block or buffer storage");
                  }
                }
                if (bVar3 == true) {
                  plVar11 = (long *)(**(code **)(*plVar13 + 0x18))(plVar13);
                  plVar11 = (long *)(**(code **)(*plVar11 + 0xf0))(plVar11);
                  cVar4 = (**(code **)(*plVar11 + 400))(plVar11,6);
                  if ((cVar4 != '\0') ||
                     (cVar4 = (**(code **)(*plVar11 + 400))(plVar11,7), cVar4 != '\0')) {
                    iVar5 = (**node->_vptr_TIntermNode)();
                    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
                      [0x18])(this,CONCAT44(extraout_var_23,iVar5),"built-in function",
                              "(u)int16 types can only be in uniform block or buffer storage");
                  }
                }
                if (bVar3 == true) {
                  plVar11 = (long *)(**(code **)(*plVar13 + 0x18))(plVar13);
                  plVar11 = (long *)(**(code **)(*plVar11 + 0xf0))(plVar11);
                  cVar4 = (**(code **)(*plVar11 + 400))(plVar11,4);
                  if ((cVar4 != '\0') ||
                     (cVar4 = (**(code **)(*plVar11 + 400))(plVar11,5), cVar4 != '\0')) {
                    iVar5 = (**node->_vptr_TIntermNode)();
                    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
                      [0x1b])(this,CONCAT44(extraout_var_24,iVar5),"built-in function",
                              "(u)int8 types can only be in uniform block or buffer storage");
                  }
                }
                if ((bVar3 == true) &&
                   (iVar5 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x1b])(function_00),
                   lVar8 == 8 && iVar5 == 0x15f)) {
                  plVar13 = (long *)(**(code **)(*plVar13 + 0x18))(plVar13);
                  plVar13 = (long *)(**(code **)(*plVar13 + 0xf0))(plVar13);
                  iVar5 = (**(code **)(*plVar13 + 0x38))(plVar13);
                  lVar9 = (**(code **)(*plVar15 + 400))();
                  plVar13 = (long *)(**(code **)(*(long *)**(undefined8 **)(lVar9 + 8) + 0x18))();
                  plVar13 = (long *)(**(code **)(*plVar13 + 0xf0))(plVar13);
                  iVar7 = (**(code **)(*plVar13 + 0x38))(plVar13);
                  if (iVar5 != iVar7) {
                    iVar5 = (**node->_vptr_TIntermNode)();
                    iVar7 = (*(function_00->super_TSymbol)._vptr_TSymbol[3])(function_00);
                    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
                      [0x2d])(this,CONCAT44(extraout_var_25,iVar5),
                              "cooperative vector basic types must match",
                              *(undefined8 *)(CONCAT44(extraout_var_26,iVar7) + 8),"");
                  }
                }
                uVar17 = uVar17 + 1;
                iVar5 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x24])(function_00);
                lVar8 = lVar8 + 8;
              } while ((long)uVar17 < (long)iVar5);
            }
            addInputArgumentConversions(this,function_00,(TIntermNode **)&stack0xfffffffffffffe98);
          }
          pTVar22 = loc;
          if (((bVar3 == true) &&
              (iVar5 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x1b])(function_00),
              pTVar20 = node, iVar5 != 0)) ||
             (iVar5 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x1b])(function_00),
             pTVar20 = node, iVar5 == 7)) {
            result = (TIntermConstantUnion *)
                     handleBuiltInFunctionCall(this,*loc,pTVar20,function_00);
          }
          else {
            pTVar18 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
            iVar5 = (*(function_00->super_TSymbol)._vptr_TSymbol[0xc])(function_00);
            result = (TIntermConstantUnion *)
                     TIntermediate::setAggregateOperator
                               (pTVar18,node,EOpFunctionCall,
                                (TType *)CONCAT44(extraout_var_27,iVar5),loc);
            iVar5 = (*(result->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[6])(result);
            callNode = (TIntermAggregate *)CONCAT44(extraout_var_28,iVar5);
            iVar5 = (*(function_00->super_TSymbol)._vptr_TSymbol[6])(function_00);
            (*(callNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x34])(callNode,CONCAT44(extraout_var_29,iVar5));
            this = pTVar21;
            if (bVar3 == false) {
              (*(callNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x36])(callNode);
              pTVar2 = (pTVar21->super_TParseContextBase).symbolTable;
              this = pTVar21;
              if ((int)((ulong)((long)(pTVar2->table).
                                      super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pTVar2->table).
                                     super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3) < 5) {
                TParseVersions::requireProfile
                          ((TParseVersions *)pTVar21,loc,-9,
                           "calling user function from global scope");
                pTVar19 = (pTVar21->super_TParseContextBase).super_TParseVersions.infoSink;
                pTVar18 = (pTVar21->super_TParseContextBase).super_TParseVersions.intermediate;
                local_f0._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
                caller = &local_c8;
                std::__cxx11::
                basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
                basic_string<glslang::std::allocator<char>>
                          ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                            *)caller,"main(",(pool_allocator<char> *)&local_f0);
                loc = pTVar22;
              }
              else {
                pTVar19 = (pTVar21->super_TParseContextBase).super_TParseVersions.infoSink;
                pTVar18 = (pTVar21->super_TParseContextBase).super_TParseVersions.intermediate;
                caller = (TType *)&pTVar21->currentCaller;
                loc = pTVar22;
              }
              iVar5 = (*(function_00->super_TSymbol)._vptr_TSymbol[6])(function_00);
              pTVar22 = loc;
              TIntermediate::addToCallGraph
                        (pTVar18,pTVar19,(TString *)caller,
                         (TString *)CONCAT44(extraout_var_30,iVar5));
            }
            if (bVar3 == true) {
              __assert_fail("PureOperatorBuiltins == false",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                            ,0xc60,
                            "void glslang::TParseContext::nonOpBuiltInCheck(const TSourceLoc &, const TFunction &, TIntermAggregate &)"
                           );
            }
            userFunctionCallCheck(this,loc,callNode);
          }
          iVar5 = (*(result->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[6])(result);
          if (CONCAT44(extraout_var_31,iVar5) != 0) {
            iVar5 = (*(result->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[6])(result);
            this_00 = (vector<glslang::TStorageQualifier,glslang::pool_allocator<glslang::TStorageQualifier>>
                       *)(**(code **)(*(long *)CONCAT44(extraout_var_32,iVar5) + 0x1c0))
                                   ((long *)CONCAT44(extraout_var_32,iVar5));
            iVar5 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x24])(function_00);
            loc = pTVar22;
            if (0 < iVar5) {
              uVar6 = 0;
              do {
                iVar5 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x28])
                                  (function_00,(ulong)uVar6);
                lVar8 = (**(code **)(**(long **)(CONCAT44(extraout_var_33,iVar5) + 8) + 0x50))();
                local_c8._vptr_TType._0_4_ = *(TStorageQualifier *)(lVar8 + 8) & 0x7f;
                __position._M_current = *(TStorageQualifier **)(this_00 + 0x10);
                if (__position._M_current == *(TStorageQualifier **)(this_00 + 0x18)) {
                  std::
                  vector<glslang::TStorageQualifier,glslang::pool_allocator<glslang::TStorageQualifier>>
                  ::_M_realloc_insert<glslang::TStorageQualifier_const&>
                            (this_00,__position,(TStorageQualifier *)&local_c8);
                }
                else {
                  *__position._M_current = (TStorageQualifier)local_c8._vptr_TType;
                  *(TStorageQualifier **)(this_00 + 0x10) = __position._M_current + 1;
                }
                uVar6 = uVar6 + 1;
                iVar5 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x24])(function_00);
              } while ((int)uVar6 < iVar5);
            }
            iVar5 = (*(result->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[6])(result);
            result = (TIntermConstantUnion *)
                     addOutputArgumentConversions
                               (this,function_00,(TIntermAggregate *)CONCAT44(extraout_var_34,iVar5)
                               );
          }
          handleCoopMat2FunctionCall(this,loc,function_00,&result->super_TIntermTyped,pTVar20);
          iVar5 = (*(result->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[3])(result);
          lVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_35,iVar5) + 0xf0))
                            ((long *)CONCAT44(extraout_var_35,iVar5));
          if ((*(byte *)(lVar8 + 0xb) & 8) != 0) {
            iVar5 = (*(result->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[3])(result);
            plVar15 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_36,iVar5) + 0xf0))
                                        ((long *)CONCAT44(extraout_var_36,iVar5));
            cVar4 = (**(code **)(*plVar15 + 0x188))(plVar15);
            if (cVar4 == '\0') {
              iVar5 = (*(result->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[7])(result)
              ;
              plVar15 = (long *)CONCAT44(extraout_var_37,iVar5);
              if (plVar15 == (long *)0x0) {
                iVar5 = (*(result->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[6])
                                  (result);
                lVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_38,iVar5) + 400))
                                  ((long *)CONCAT44(extraout_var_38,iVar5));
                plVar15 = (long *)(**(code **)(*(long *)**(undefined8 **)(lVar8 + 8) + 0x18))();
              }
              else {
                plVar15 = (long *)(**(code **)(*plVar15 + 0x188))(plVar15);
                plVar15 = (long *)(**(code **)(*plVar15 + 0x18))(plVar15);
              }
              uVar10 = (**(code **)(*plVar15 + 0xf0))(plVar15);
              (*(result->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1d])
                        (result,uVar10);
            }
          }
        }
      }
      else {
        result = (TIntermConstantUnion *)0x0;
        pTVar21 = this;
        TType::TType(&local_c8,EbtVoid,EvqTemporary,1,0,0,false);
        op = (*(function->super_TSymbol)._vptr_TSymbol[0x1b])(function);
        bVar3 = constructorError(this,loc,arguments,function,op,&local_c8);
        if ((!bVar3) &&
           (result = (TIntermConstantUnion *)addConstructor(this,loc,arguments,&local_c8),
           result == (TIntermConstantUnion *)0x0)) {
          pTVar18 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          EVar1 = pTVar18->source;
          bVar3 = pTVar18->enhancedMsgs;
          local_118 = GetThreadPoolAllocator();
          local_110 = local_100;
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          _M_construct<char_const*>
                    ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                     &local_118,"","");
          pTVar14 = GetThreadPoolAllocator();
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          _M_construct<char_const*>
                    ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                     &stack0xfffffffffffffec0,"","");
          name._M_dataplus._M_p = (pointer)&stack0xfffffffffffffec0;
          name._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)&local_118;
          name._M_string_length = in_stack_fffffffffffffe88;
          name.field_2._M_allocated_capacity._0_7_ = in_stack_fffffffffffffe90;
          name.field_2._M_local_buf[7] = in_stack_fffffffffffffe97;
          name.field_2._8_8_ = node;
          structName._M_dataplus._M_p = (pointer)in_stack_fffffffffffffea8;
          structName._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)pTVar21;
          structName._M_string_length = in_stack_fffffffffffffeb0;
          structName.field_2._M_allocated_capacity = in_stack_fffffffffffffeb8;
          structName.field_2._8_8_ = pTVar14;
          this = pTVar21;
          TType::getCompleteString
                    (&local_f0,&local_c8,(bool)(EVar1 == EShSourceGlsl & bVar3),true,true,true,name,
                     structName);
          result = (TIntermConstantUnion *)0x0;
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"cannot construct with these arguments",local_f0._M_dataplus._M_p,"");
        }
      }
    }
    if (result == (TIntermConstantUnion *)0x0) {
      result = TIntermediate::addConstantUnion
                         ((this->super_TParseContextBase).super_TParseVersions.intermediate,0.0,
                          EbtFloat,loc,false);
    }
  }
  return &result->super_TIntermTyped;
}

Assistant:

TIntermTyped* TParseContext::handleFunctionCall(const TSourceLoc& loc, TFunction* function, TIntermNode* arguments)
{
    TIntermTyped* result = nullptr;

    if (spvVersion.vulkan != 0 && spvVersion.vulkanRelaxed) {
        // allow calls that are invalid in Vulkan Semantics to be invisibily
        // remapped to equivalent valid functions
        result = vkRelaxedRemapFunctionCall(loc, function, arguments);
        if (result)
            return result;
    }

    if (function->getBuiltInOp() == EOpArrayLength)
        result = handleLengthMethod(loc, function, arguments);
    else if (function->getBuiltInOp() != EOpNull) {
        //
        // Then this should be a constructor.
        // Don't go through the symbol table for constructors.
        // Their parameters will be verified algorithmically.
        //
        TType type(EbtVoid);  // use this to get the type back
        if (! constructorError(loc, arguments, *function, function->getBuiltInOp(), type)) {
            //
            // It's a constructor, of type 'type'.
            //
            result = addConstructor(loc, arguments, type);
            if (result == nullptr)
                error(loc, "cannot construct with these arguments", type.getCompleteString(intermediate.getEnhancedMsgs()).c_str(), "");
        }
    } else {
        //
        // Find it in the symbol table.
        //
        const TFunction* fnCandidate;
        bool builtIn {false};
        fnCandidate = findFunction(loc, *function, builtIn);
        if (fnCandidate) {
            // This is a declared function that might map to
            //  - a built-in operator,
            //  - a built-in function not mapped to an operator, or
            //  - a user function.

            // Error check for a function requiring specific extensions present.
            if (builtIn &&
                (fnCandidate->getBuiltInOp() == EOpSubgroupQuadAll || fnCandidate->getBuiltInOp() == EOpSubgroupQuadAny))
                requireExtensions(loc, 1, &E_GL_EXT_shader_quad_control, fnCandidate->getName().c_str());

            if (builtIn && fnCandidate->getNumExtensions())
                requireExtensions(loc, fnCandidate->getNumExtensions(), fnCandidate->getExtensions(), fnCandidate->getName().c_str());

            if (builtIn && fnCandidate->getType().contains16BitFloat())
                requireFloat16Arithmetic(loc, "built-in function", "float16 types can only be in uniform block or buffer storage");
            if (builtIn && fnCandidate->getType().contains16BitInt())
                requireInt16Arithmetic(loc, "built-in function", "(u)int16 types can only be in uniform block or buffer storage");
            if (builtIn && fnCandidate->getType().contains8BitInt())
                requireInt8Arithmetic(loc, "built-in function", "(u)int8 types can only be in uniform block or buffer storage");
            if (builtIn && (fnCandidate->getBuiltInOp() == EOpTextureFetch || fnCandidate->getBuiltInOp() == EOpTextureQuerySize)) {
                if ((*fnCandidate)[0].type->getSampler().isMultiSample() && version <= 140)
                    requireExtensions(loc, 1, &E_GL_ARB_texture_multisample, fnCandidate->getName().c_str());
            }
            if (arguments != nullptr) {
                // Make sure qualifications work for these arguments.
                TIntermAggregate* aggregate = arguments->getAsAggregate();
                for (int i = 0; i < fnCandidate->getParamCount(); ++i) {
                    // At this early point there is a slight ambiguity between whether an aggregate 'arguments'
                    // is the single argument itself or its children are the arguments.  Only one argument
                    // means take 'arguments' itself as the one argument.
                    TIntermNode* arg = fnCandidate->getParamCount() == 1 ? arguments : (aggregate ? aggregate->getSequence()[i] : arguments);
                    TQualifier& formalQualifier = (*fnCandidate)[i].type->getQualifier();
                    if (formalQualifier.isParamOutput()) {
                        if (lValueErrorCheck(arguments->getLoc(), "assign", arg->getAsTyped()))
                            error(arguments->getLoc(), "Non-L-value cannot be passed for 'out' or 'inout' parameters.", "out", "");
                    }
                    if (formalQualifier.isSpirvLiteral()) {
                        if (!arg->getAsTyped()->getQualifier().isFrontEndConstant()) {
                            error(arguments->getLoc(),
                                  "Non front-end constant expressions cannot be passed for 'spirv_literal' parameters.",
                                  "spirv_literal", "");
                        }
                    }
                    const TType& argType = arg->getAsTyped()->getType();
                    const TQualifier& argQualifier = argType.getQualifier();
                    bool containsBindlessSampler = intermediate.getBindlessMode() && argType.containsSampler();
                    if (argQualifier.isMemory() && !containsBindlessSampler && (argType.containsOpaque() || argType.isReference())) {
                        const char* message = "argument cannot drop memory qualifier when passed to formal parameter";
                        if (argQualifier.volatil && ! formalQualifier.volatil)
                            error(arguments->getLoc(), message, "volatile", "");
                        if (argQualifier.coherent && ! (formalQualifier.devicecoherent || formalQualifier.coherent))
                            error(arguments->getLoc(), message, "coherent", "");
                        if (argQualifier.devicecoherent && ! (formalQualifier.devicecoherent || formalQualifier.coherent))
                            error(arguments->getLoc(), message, "devicecoherent", "");
                        if (argQualifier.queuefamilycoherent && ! (formalQualifier.queuefamilycoherent || formalQualifier.devicecoherent || formalQualifier.coherent))
                            error(arguments->getLoc(), message, "queuefamilycoherent", "");
                        if (argQualifier.workgroupcoherent && ! (formalQualifier.workgroupcoherent || formalQualifier.queuefamilycoherent || formalQualifier.devicecoherent || formalQualifier.coherent))
                            error(arguments->getLoc(), message, "workgroupcoherent", "");
                        if (argQualifier.subgroupcoherent && ! (formalQualifier.subgroupcoherent || formalQualifier.workgroupcoherent || formalQualifier.queuefamilycoherent || formalQualifier.devicecoherent || formalQualifier.coherent))
                            error(arguments->getLoc(), message, "subgroupcoherent", "");
                        if (argQualifier.readonly && ! formalQualifier.readonly)
                            error(arguments->getLoc(), message, "readonly", "");
                        if (argQualifier.writeonly && ! formalQualifier.writeonly)
                            error(arguments->getLoc(), message, "writeonly", "");
                        if (argQualifier.nontemporal && ! formalQualifier.nontemporal)
                            error(arguments->getLoc(), message, "nontemporal", "");
                        // Don't check 'restrict', it is different than the rest:
                        // "...but only restrict can be taken away from a calling argument, by a formal parameter that
                        // lacks the restrict qualifier..."
                    }
                    if (!builtIn && argQualifier.getFormat() != formalQualifier.getFormat()) {
                        // we have mismatched formats, which should only be allowed if writeonly
                        // and at least one format is unknown
                        if (!formalQualifier.isWriteOnly() || (formalQualifier.getFormat() != ElfNone &&
                                                                  argQualifier.getFormat() != ElfNone))
                            error(arguments->getLoc(), "image formats must match", "format", "");
                    }
                    if (builtIn && arg->getAsTyped()->getType().contains16BitFloat())
                        requireFloat16Arithmetic(arguments->getLoc(), "built-in function", "float16 types can only be in uniform block or buffer storage");
                    if (builtIn && arg->getAsTyped()->getType().contains16BitInt())
                        requireInt16Arithmetic(arguments->getLoc(), "built-in function", "(u)int16 types can only be in uniform block or buffer storage");
                    if (builtIn && arg->getAsTyped()->getType().contains8BitInt())
                        requireInt8Arithmetic(arguments->getLoc(), "built-in function", "(u)int8 types can only be in uniform block or buffer storage");

                    // Check that coopVecOuterProductAccumulateNV vector component types match
                    if (builtIn && fnCandidate->getBuiltInOp() == EOpCooperativeVectorOuterProductAccumulateNV &&
                        i == 1 && arg->getAsTyped()->getType().getBasicType() != aggregate->getSequence()[0]->getAsTyped()->getType().getBasicType())
                        error(arguments->getLoc(), "cooperative vector basic types must match", fnCandidate->getName().c_str(), "");

                    // TODO 4.5 functionality:  A shader will fail to compile
                    // if the value passed to the memargument of an atomic memory function does not correspond to a buffer or
                    // shared variable. It is acceptable to pass an element of an array or a single component of a vector to the
                    // memargument of an atomic memory function, as long as the underlying array or vector is a buffer or
                    // shared variable.
                }

                // Convert 'in' arguments
                addInputArgumentConversions(*fnCandidate, arguments);  // arguments may be modified if it's just a single argument node
            }

            if (builtIn && fnCandidate->getBuiltInOp() != EOpNull) {
                // A function call mapped to a built-in operation.
                result = handleBuiltInFunctionCall(loc, arguments, *fnCandidate);
            } else if (fnCandidate->getBuiltInOp() == EOpSpirvInst) {
                // When SPIR-V instruction qualifier is specified, the function call is still mapped to a built-in operation.
                result = handleBuiltInFunctionCall(loc, arguments, *fnCandidate);
            } else {
                // This is a function call not mapped to built-in operator.
                // It could still be a built-in function, but only if PureOperatorBuiltins == false.
                result = intermediate.setAggregateOperator(arguments, EOpFunctionCall, fnCandidate->getType(), loc);
                TIntermAggregate* call = result->getAsAggregate();
                call->setName(fnCandidate->getMangledName());

                // this is how we know whether the given function is a built-in function or a user-defined function
                // if builtIn == false, it's a userDefined -> could be an overloaded built-in function also
                // if builtIn == true, it's definitely a built-in function with EOpNull
                if (! builtIn) {
                    call->setUserDefined();
                    if (symbolTable.atGlobalLevel()) {
                        requireProfile(loc, ~EEsProfile, "calling user function from global scope");
                        intermediate.addToCallGraph(infoSink, "main(", fnCandidate->getMangledName());
                    } else
                        intermediate.addToCallGraph(infoSink, currentCaller, fnCandidate->getMangledName());
                }

                if (builtIn)
                    nonOpBuiltInCheck(loc, *fnCandidate, *call);
                else
                    userFunctionCallCheck(loc, *call);
            }

            // Convert 'out' arguments.  If it was a constant folded built-in, it won't be an aggregate anymore.
            // Built-ins with a single argument aren't called with an aggregate, but they also don't have an output.
            // Also, build the qualifier list for user function calls, which are always called with an aggregate.
            if (result->getAsAggregate()) {
                TQualifierList& qualifierList = result->getAsAggregate()->getQualifierList();
                for (int i = 0; i < fnCandidate->getParamCount(); ++i) {
                    TStorageQualifier qual = (*fnCandidate)[i].type->getQualifier().storage;
                    qualifierList.push_back(qual);
                }
                result = addOutputArgumentConversions(*fnCandidate, *result->getAsAggregate());
            }

            handleCoopMat2FunctionCall(loc, fnCandidate, result, arguments);

            if (result->getAsTyped()->getType().isCoopVecNV() &&
               !result->getAsTyped()->getType().isParameterized()) {
                if (auto unaryNode = result->getAsUnaryNode())
                    result->setType(unaryNode->getOperand()->getAsTyped()->getType());
                else
                    result->setType(result->getAsAggregate()->getSequence()[0]->getAsTyped()->getType());
            }
        }
    }

    // generic error recovery
    // TODO: simplification: localize all the error recoveries that look like this, and taking type into account to reduce cascades
    if (result == nullptr)
        result = intermediate.addConstantUnion(0.0, EbtFloat, loc);

    return result;
}